

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# es31fTextureGatherTests.cpp
# Opt level: O0

void __thiscall
deqp::gles31::Functional::anon_unknown_0::TextureGatherCubeCase::createAndUploadTexture
          (TextureGatherCubeCase *this)

{
  PtrData<glu::TextureCube,_de::DefaultDeleter<glu::TextureCube>_> data;
  bool bVar1;
  deUint32 internalFormat;
  CubeFace CVar2;
  TestLog *this_00;
  RenderContext *context;
  float extraout_var;
  TextureCube *pTVar3;
  ConstPixelBufferAccess *pCVar4;
  CommandLine *this_01;
  TestLog *pTVar5;
  MessageBuilder *pMVar6;
  TextureCube *in_stack_fffffffffffffb08;
  undefined8 in_stack_fffffffffffffb10;
  int local_494;
  int local_464;
  MessageBuilder local_460;
  string local_2e0;
  CubeFace local_2bc;
  string local_2b8;
  string local_298;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_278;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_258;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_238;
  LogImage local_218;
  ConstPixelBufferAccess *local_188;
  PixelBufferAccess *levelFace;
  CubeFace cubeFace;
  int cubeFaceI;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_158;
  string local_138;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_118;
  LogImageSet local_f8;
  int local_b4;
  int local_b0;
  int levelNdx;
  int levelEnd;
  int levelBegin;
  TextureCube *refTexture;
  TextureFormat local_90;
  PtrData<glu::TextureCube,_de::DefaultDeleter<glu::TextureCube>_> local_88;
  PtrData<glu::TextureCube,_de::DefaultDeleter<glu::TextureCube>_> *local_78;
  undefined1 local_68 [8];
  TextureFormatInfo texFmtInfo;
  Functions *gl;
  RenderContext *renderCtx;
  TestLog *log;
  TextureGatherCubeCase *this_local;
  
  this_00 = tcu::TestContext::getLog
                      ((this->super_TextureGatherCase).super_TestCase.super_TestCase.super_TestNode.
                       m_testCtx);
  context = Context::getRenderContext((this->super_TextureGatherCase).super_TestCase.m_context);
  texFmtInfo.lookupBias.m_data[2] = (float)(*context->_vptr_RenderContext[3])();
  texFmtInfo.lookupBias.m_data[3] = extraout_var;
  tcu::getTextureFormatInfo
            ((TextureFormatInfo *)local_68,&(this->super_TextureGatherCase).m_textureFormat);
  pTVar3 = (TextureCube *)operator_new(0x180);
  local_90 = (this->super_TextureGatherCase).m_textureFormat;
  internalFormat = glu::getInternalFormat(local_90);
  glu::TextureCube::TextureCube(pTVar3,context,internalFormat,this->m_textureSize);
  de::DefaultDeleter<glu::TextureCube>::DefaultDeleter
            ((DefaultDeleter<glu::TextureCube> *)((long)&refTexture + 3));
  de::details::MovePtr<glu::TextureCube,_de::DefaultDeleter<glu::TextureCube>_>::MovePtr();
  local_78 = de::details::MovePtr::operator_cast_to_PtrData(&local_88,(MovePtr *)pTVar3);
  data._8_8_ = in_stack_fffffffffffffb10;
  data.ptr = in_stack_fffffffffffffb08;
  de::details::MovePtr<glu::TextureCube,_de::DefaultDeleter<glu::TextureCube>_>::operator=
            (&this->m_texture,data);
  de::details::MovePtr<glu::TextureCube,_de::DefaultDeleter<glu::TextureCube>_>::~MovePtr
            ((MovePtr<glu::TextureCube,_de::DefaultDeleter<glu::TextureCube>_> *)&local_88);
  pTVar3 = de::details::UniqueBase<glu::TextureCube,_de::DefaultDeleter<glu::TextureCube>_>::
           operator->(&(this->m_texture).
                       super_UniqueBase<glu::TextureCube,_de::DefaultDeleter<glu::TextureCube>_>);
  _levelEnd = glu::TextureCube::getRefTexture(pTVar3);
  levelNdx = (this->super_TextureGatherCase).m_baseLevel;
  bVar1 = isMipmapFilter((this->super_TextureGatherCase).m_minFilter);
  if ((bVar1) && (((this->super_TextureGatherCase).m_flags & 1) == 0)) {
    local_494 = tcu::TextureCube::getNumLevels(_levelEnd);
  }
  else {
    local_494 = (this->super_TextureGatherCase).m_baseLevel + 1;
  }
  local_b0 = local_494;
  for (local_b4 = levelNdx; local_b4 < local_b0; local_b4 = local_b4 + 1) {
    de::toString<int>(&local_138,&local_b4);
    std::operator+(&local_118,"InputTextureLevel",&local_138);
    de::toString<int>((string *)&cubeFace,&local_b4);
    std::operator+(&local_158,"Input texture, level ",
                   (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&cubeFace);
    tcu::LogImageSet::LogImageSet(&local_f8,&local_118,&local_158);
    tcu::TestLog::operator<<(this_00,&local_f8);
    tcu::LogImageSet::~LogImageSet(&local_f8);
    std::__cxx11::string::~string((string *)&local_158);
    std::__cxx11::string::~string((string *)&cubeFace);
    std::__cxx11::string::~string((string *)&local_118);
    std::__cxx11::string::~string((string *)&local_138);
    for (levelFace._4_4_ = CUBEFACE_NEGATIVE_X; (int)levelFace._4_4_ < 6;
        levelFace._4_4_ = levelFace._4_4_ + CUBEFACE_POSITIVE_X) {
      levelFace._0_4_ = levelFace._4_4_;
      tcu::TextureCube::allocLevel(_levelEnd,levelFace._4_4_,local_b4);
      pCVar4 = &tcu::TextureCube::getLevelFace(_levelEnd,local_b4,(CubeFace)levelFace)->
                super_ConstPixelBufferAccess;
      local_188 = pCVar4;
      this_01 = tcu::TestContext::getCommandLine
                          ((this->super_TextureGatherCase).super_TestCase.super_TestCase.
                           super_TestNode.m_testCtx);
      CVar2 = tcu::CommandLine::getBaseSeed(this_01);
      fillWithRandomColorTiles
                ((PixelBufferAccess *)pCVar4,(Vec4 *)local_68,
                 (Vec4 *)(texFmtInfo.valueMin.m_data + 2),CVar2 ^ levelFace._4_4_);
      pTVar5 = tcu::TestContext::getLog
                         ((this->super_TextureGatherCase).super_TestCase.super_TestCase.
                          super_TestNode.m_testCtx);
      de::toString<int>(&local_298,&local_b4);
      std::operator+(&local_278,"InputTextureLevel",&local_298);
      std::operator+(&local_258,&local_278,"Face");
      local_2bc = (CubeFace)levelFace;
      de::toString<int>(&local_2b8,(int *)&local_2bc);
      std::operator+(&local_238,&local_258,&local_2b8);
      de::toString<tcu::CubeFace>(&local_2e0,(CubeFace *)&levelFace);
      tcu::LogImage::LogImage
                (&local_218,&local_238,&local_2e0,local_188,QP_IMAGE_COMPRESSION_MODE_BEST);
      tcu::TestLog::operator<<(pTVar5,&local_218);
      tcu::LogImage::~LogImage(&local_218);
      std::__cxx11::string::~string((string *)&local_2e0);
      std::__cxx11::string::~string((string *)&local_238);
      std::__cxx11::string::~string((string *)&local_2b8);
      std::__cxx11::string::~string((string *)&local_258);
      std::__cxx11::string::~string((string *)&local_278);
      std::__cxx11::string::~string((string *)&local_298);
    }
    pTVar5 = tcu::TestLog::operator<<(this_00,(EndImageSetToken *)&tcu::TestLog::EndImageSet);
    tcu::TestLog::operator<<(&local_460,pTVar5,(BeginMessageToken *)&tcu::TestLog::Message);
    pMVar6 = tcu::MessageBuilder::operator<<
                       (&local_460,(char (*) [31])"Note: texture level\'s size is ");
    pCVar4 = &tcu::TextureCube::getLevelFace(_levelEnd,local_b4,CUBEFACE_NEGATIVE_X)->
              super_ConstPixelBufferAccess;
    local_464 = tcu::ConstPixelBufferAccess::getWidth(pCVar4);
    pMVar6 = tcu::MessageBuilder::operator<<(pMVar6,&local_464);
    tcu::MessageBuilder::operator<<(pMVar6,(EndMessageToken *)&tcu::TestLog::EndMessage);
    tcu::MessageBuilder::~MessageBuilder(&local_460);
  }
  swizzleTexture(&this->m_swizzledTexture,_levelEnd,
                 &(this->super_TextureGatherCase).m_textureSwizzle);
  (**(code **)(texFmtInfo.lookupBias.m_data._8_8_ + 8))(0x84c0);
  pTVar3 = de::details::UniqueBase<glu::TextureCube,_de::DefaultDeleter<glu::TextureCube>_>::
           operator->(&(this->m_texture).
                       super_UniqueBase<glu::TextureCube,_de::DefaultDeleter<glu::TextureCube>_>);
  glu::TextureCube::upload(pTVar3);
  return;
}

Assistant:

void TextureGatherCubeCase::createAndUploadTexture (void)
{
	TestLog&						log			= m_testCtx.getLog();
	const glu::RenderContext&		renderCtx	= m_context.getRenderContext();
	const glw::Functions&			gl			= renderCtx.getFunctions();
	const tcu::TextureFormatInfo	texFmtInfo	= tcu::getTextureFormatInfo(m_textureFormat);

	m_texture = MovePtr<glu::TextureCube>(new glu::TextureCube(renderCtx, glu::getInternalFormat(m_textureFormat), m_textureSize));

	{
		tcu::TextureCube&	refTexture	= m_texture->getRefTexture();
		const int			levelBegin	= m_baseLevel;
		const int			levelEnd	= isMipmapFilter(m_minFilter) && !(m_flags & GATHERCASE_MIPMAP_INCOMPLETE) ? refTexture.getNumLevels() : m_baseLevel+1;
		DE_ASSERT(m_baseLevel < refTexture.getNumLevels());

		for (int levelNdx = levelBegin; levelNdx < levelEnd; levelNdx++)
		{
			log << TestLog::ImageSet("InputTextureLevel" + de::toString(levelNdx), "Input texture, level " + de::toString(levelNdx));

			for (int cubeFaceI = 0; cubeFaceI < tcu::CUBEFACE_LAST; cubeFaceI++)
			{
				const tcu::CubeFace			cubeFace	= (tcu::CubeFace)cubeFaceI;
				refTexture.allocLevel(cubeFace, levelNdx);
				const PixelBufferAccess&	levelFace	= refTexture.getLevelFace(levelNdx, cubeFace);
				fillWithRandomColorTiles(levelFace, texFmtInfo.valueMin, texFmtInfo.valueMax, (deUint32)m_testCtx.getCommandLine().getBaseSeed() ^ (deUint32)cubeFaceI);

				m_testCtx.getLog() << TestLog::Image("InputTextureLevel" + de::toString(levelNdx) + "Face" + de::toString((int)cubeFace),
													 de::toString(cubeFace),
													 levelFace);
			}

			log << TestLog::EndImageSet
				<< TestLog::Message << "Note: texture level's size is " << refTexture.getLevelFace(levelNdx, tcu::CUBEFACE_NEGATIVE_X).getWidth() << TestLog::EndMessage;
		}

		swizzleTexture(m_swizzledTexture, refTexture, m_textureSwizzle);
	}

	gl.activeTexture(GL_TEXTURE0);
	m_texture->upload();
}